

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

int yaml_parser_roll_indent
              (yaml_parser_t *parser,ptrdiff_t column,ptrdiff_t number,yaml_token_type_t type,
              yaml_mark_t mark)

{
  int **top;
  yaml_token_t **ppyVar1;
  yaml_token_t **end;
  undefined8 *puVar2;
  yaml_token_t *pyVar3;
  int iVar4;
  yaml_token_t *pyVar5;
  int *piVar6;
  long lVar7;
  uint local_4c;
  undefined4 uStack_38;
  
  if (parser->flow_level != 0) {
    return 1;
  }
  iVar4 = parser->indent;
  if (column <= iVar4) {
    return 1;
  }
  top = &(parser->indents).top;
  piVar6 = (parser->indents).top;
  if (piVar6 == (parser->indents).end) {
    iVar4 = yaml_stack_extend(&(parser->indents).start,top,&(parser->indents).end);
    if (iVar4 == 0) goto LAB_00167798;
    iVar4 = parser->indent;
    piVar6 = (parser->indents).top;
  }
  *top = piVar6 + 1;
  *piVar6 = iVar4;
  if (0x7fffffff < column) {
LAB_00167798:
    parser->error = YAML_MEMORY_ERROR;
    return 0;
  }
  parser->indent = (int)column;
  uStack_38 = mark.column._4_4_;
  local_4c = (uint)mark.index;
  ppyVar1 = &(parser->tokens).tail;
  end = &(parser->tokens).end;
  pyVar3 = (parser->tokens).end;
  pyVar5 = (parser->tokens).tail;
  if (number == -1) {
    if (pyVar5 == pyVar3) {
      iVar4 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,ppyVar1,end);
      if (iVar4 == 0) goto LAB_00167798;
      pyVar5 = *ppyVar1;
    }
    *ppyVar1 = pyVar5 + 1;
    pyVar5->type = type;
    *(undefined8 *)&pyVar5->field_0x4 = 0;
    *(undefined8 *)((long)&(pyVar5->data).alias.value + 4) = 0;
    *(undefined8 *)((long)&(pyVar5->data).tag.suffix + 4) = 0;
    *(ulong *)((long)&pyVar5->data + 0x14) = (ulong)local_4c << 0x20;
    *(long *)((long)&(pyVar5->start_mark).index + 4) = mark._4_8_;
    *(long *)((long)&(pyVar5->start_mark).line + 4) = mark._12_8_;
    *(undefined4 *)((long)&(pyVar5->start_mark).column + 4) = uStack_38;
    (pyVar5->end_mark).index = mark.index;
    (pyVar5->end_mark).line = mark.line;
    (pyVar5->end_mark).column = mark.column;
    return 1;
  }
  if (pyVar5 == pyVar3) {
    iVar4 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,ppyVar1,end);
    if (iVar4 == 0) goto LAB_00167798;
    pyVar5 = *ppyVar1;
  }
  lVar7 = number - parser->tokens_parsed;
  pyVar3 = (parser->tokens).head;
  memmove(pyVar3 + lVar7 + 1,pyVar3 + lVar7,
          (((ulong)((long)pyVar5 - (long)pyVar3) >> 4) * -0x3333333333333333 - lVar7) * 0x50);
  pyVar3 = (parser->tokens).head;
  lVar7 = number - parser->tokens_parsed;
  pyVar3[lVar7].type = type;
  *(undefined4 *)((long)&pyVar3[lVar7].start_mark.column + 4) = uStack_38;
  puVar2 = (undefined8 *)((long)&pyVar3[lVar7].start_mark.index + 4);
  *puVar2 = mark._4_8_;
  puVar2[1] = mark._12_8_;
  puVar2 = (undefined8 *)((long)&pyVar3[lVar7].data.scalar.length + 4);
  *puVar2 = 0;
  puVar2[1] = (ulong)local_4c << 0x20;
  *(undefined8 *)&pyVar3[lVar7].field_0x4 = 0;
  *(undefined8 *)(&pyVar3[lVar7].field_0x4 + 8) = 0;
  pyVar3[lVar7].end_mark.column = mark.column;
  pyVar3[lVar7].end_mark.index = mark.index;
  pyVar3[lVar7].end_mark.line = mark.line;
  ppyVar1 = &(parser->tokens).tail;
  *ppyVar1 = *ppyVar1 + 1;
  return 1;
}

Assistant:

static int
yaml_parser_roll_indent(yaml_parser_t *parser, ptrdiff_t column,
        ptrdiff_t number, yaml_token_type_t type, yaml_mark_t mark)
{
    yaml_token_t token;

    /* In the flow context, do nothing. */

    if (parser->flow_level)
        return 1;

    if (parser->indent < column)
    {
        /*
         * Push the current indentation level to the stack and set the new
         * indentation level.
         */

        if (!PUSH(parser, parser->indents, parser->indent))
            return 0;

        if (column > INT_MAX) {
            parser->error = YAML_MEMORY_ERROR;
            return 0;
        }

        parser->indent = column;

        /* Create a token and insert it into the queue. */

        TOKEN_INIT(token, type, mark, mark);

        if (number == -1) {
            if (!ENQUEUE(parser, parser->tokens, token))
                return 0;
        }
        else {
            if (!QUEUE_INSERT(parser,
                        parser->tokens, number - parser->tokens_parsed, token))
                return 0;
        }
    }

    return 1;
}